

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::GlobalObject::GetSetter
          (GlobalObject *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyId propertyId;
  DescriptorFlags DVar1;
  ScriptContext *this_00;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  GlobalObject *this_local;
  
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::GetOrAddPropertyRecord(this_00,(JavascriptString *)setterValue_local,&local_38);
  propertyId = PropertyRecord::GetPropertyId(local_38);
  DVar1 = GetSetter(this,propertyId,&info_local->m_instance,
                    (PropertyValueInfo *)requestContext_local,(ScriptContext *)propertyRecord);
  return DVar1;
}

Assistant:

DescriptorFlags GlobalObject::GetSetter(JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return GlobalObject::GetSetter(propertyRecord->GetPropertyId(), setterValue, info, requestContext);
    }